

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall ON_PolyCurve::Insert(ON_PolyCurve *this,int segment_index,ON_Curve *c)

{
  double dVar1;
  uint uVar2;
  ON_Curve *pOVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  double *pdVar8;
  ulong uVar9;
  double s1;
  double s0;
  double t1;
  double local_70;
  double local_68;
  ON_Curve *local_60;
  double local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  double local_30;
  
  if (((segment_index < 0) ||
      (uVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count,
      ((ON_PolyCurve *)c == this || c == (ON_Curve *)0x0) || (int)uVar2 < segment_index)) ||
     (local_60 = c, bVar4 = ON_Curve::GetDomain(c,&local_68,&local_70), !bVar4)) {
    return false;
  }
  if (uVar2 == 0) {
    ON_SimpleArray<ON_Curve_*>::Insert
              (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,segment_index,&local_60);
    ON_SimpleArray<double>::Append(&this->m_t,&local_68);
    pdVar8 = &local_70;
  }
  else {
    iVar5 = (*(c->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])(c);
    iVar6 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(this);
    pOVar3 = local_60;
    if (iVar5 != iVar6) {
      uVar7 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])
                        (this);
      iVar5 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])
                        (pOVar3,(ulong)uVar7);
      if ((char)iVar5 == '\0') {
        return false;
      }
    }
    ON_SimpleArray<ON_Curve_*>::Insert
              (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,segment_index,&local_60);
    if (uVar2 != segment_index) {
      pdVar8 = (this->m_t).m_a;
      if (segment_index == 0) {
        local_58 = *pdVar8;
        local_30 = (double)(-(ulong)(local_70 == local_58) & (ulong)local_68 |
                           ~-(ulong)(local_70 == local_58) &
                           (ulong)((local_68 - local_70) + local_58));
        ON_SimpleArray<double>::Insert(&this->m_t,0,&local_30);
        return true;
      }
      local_50 = pdVar8[(uint)segment_index];
      local_58 = (double)(-(ulong)(local_68 == local_50) & (ulong)local_70 |
                         ~-(ulong)(local_68 == local_50) & (ulong)((local_70 - local_68) + local_50)
                         );
      uStack_40 = 0;
      iVar5 = segment_index + 1;
      local_48 = local_58;
      ON_SimpleArray<double>::Insert(&this->m_t,iVar5,&local_58);
      if (uVar2 <= (uint)segment_index) {
        return true;
      }
      pdVar8 = (this->m_t).m_a + (segment_index + 2);
      do {
        *pdVar8 = *pdVar8 + (local_48 - local_50);
        iVar5 = iVar5 + 1;
        pdVar8 = pdVar8 + 1;
      } while (iVar5 <= (int)uVar2);
      return true;
    }
    dVar1 = (this->m_t).m_a[(uint)segment_index];
    uVar9 = -(ulong)(local_68 == dVar1);
    local_58 = (double)(uVar9 & (ulong)local_70 | ~uVar9 & (ulong)((local_70 - local_68) + dVar1));
    pdVar8 = &local_58;
  }
  ON_SimpleArray<double>::Append(&this->m_t,pdVar8);
  return true;
}

Assistant:

bool ON_PolyCurve::Insert( int segment_index, ON_Curve* c )
{
  double s0, s1;
  bool rc = false;
  const int count = Count();
  if ( segment_index >= 0 && segment_index <= count && c && c != this && 
		c->GetDomain(&s0,&s1) ) 
  {
		rc = true;
		if (count > 0 && c->Dimension() != Dimension())			// 1-Sept-2017 (GBA)  Dimensions must agree
		{
			rc = c->ChangeDimension(Dimension());									// If not change the dimension of *c to match
		}

		if (rc)
		{
			m_segment.Insert(segment_index, c);

			// determine polycurve parameters for this segment
			double t0, t1;
			if (segment_index == count) {
				// append segment
				if (count == 0) {
					m_t.Append(s0);
					m_t.Append(s1);
				}
				else {
					t0 = m_t[count];
					t1 = (s0 == t0) ? s1 : (s1 - s0 + t0);
					m_t.Append(t1);
				}
			}
			else if (segment_index == 0) {
				// prepend segment
				t1 = m_t[0];
				t0 = (s1 == t1) ? s0 : (s0 - s1 + t1);
				m_t.Insert(0, t0);
			}
			else {
				// insert segment
				t0 = m_t[segment_index];
				t1 = (s0 == t0) ? s1 : (s1 - s0 + t0);
				const double dt = t1 - t0;
				m_t.Insert(segment_index + 1, t1);
				double* t = m_t.Array();
				for (int i = segment_index + 2; i <= count + 1; i++) {
					t[i] += dt;
				}
			}
		}
  }
  return rc;
}